

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O2

void remora::bindings::
     matrix_assign_functor<remora::device_traits<remora::cpu_tag>::multiply_and_add<double>,remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::dense_tag>
               (undefined8 f,long *m,long e)

{
  size_t i;
  long lVar1;
  long local_60;
  long local_58;
  undefined8 local_50;
  type rowM;
  
  for (lVar1 = 0; lVar1 != m[1]; lVar1 = lVar1 + 1) {
    rowM.m_values = (double *)(m[3] * lVar1 * 8 + *m);
    rowM.m_size = m[2];
    rowM.m_stride = 1;
    local_58 = *(long *)(e + 8);
    local_60 = local_58 * lVar1 * 8 + *(long *)(e + 0x10);
    local_50 = 1;
    vector_assign_functor<remora::dense_vector_adaptor<double,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,remora::device_traits<remora::cpu_tag>::multiply_and_add<double>>
              (f,&rowM,&local_60);
  }
  return;
}

Assistant:

void matrix_assign_functor(
	matrix_expression<M, cpu_tag>& m,
	matrix_expression<E, cpu_tag> const& e,
	F f,
	row_major, row_major, dense_tag, TagE
) {
	for(std::size_t i = 0; i != m().size1(); ++i){
		auto rowM = row(m,i);
		kernels::assign(rowM,row(e,i),f);
	}
}